

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_cleanup(archive_read *a)

{
  void *__ptr;
  undefined8 uVar1;
  links_entry_conflict *lp;
  cpio_conflict *cpio;
  archive_read *a_local;
  
  __ptr = a->format->data;
  while (*(long *)((long)__ptr + 0x10) != 0) {
    uVar1 = **(undefined8 **)((long)__ptr + 0x10);
    free(*(void **)(*(long *)((long)__ptr + 0x10) + 0x28));
    free(*(void **)((long)__ptr + 0x10));
    *(undefined8 *)((long)__ptr + 0x10) = uVar1;
  }
  free(__ptr);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_cpio_cleanup(struct archive_read *a)
{
	struct cpio *cpio;

	cpio = (struct cpio *)(a->format->data);
        /* Free inode->name map */
        while (cpio->links_head != NULL) {
                struct links_entry *lp = cpio->links_head->next;

                free(cpio->links_head->name);
                free(cpio->links_head);
                cpio->links_head = lp;
        }
	free(cpio);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}